

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O2

void __thiscall jpge::jpeg_encoder::flush_output_buffer(jpeg_encoder *this)

{
  undefined1 uVar1;
  int iVar2;
  
  if (this->m_out_buf_left != 0x800) {
    if (this->m_all_stream_writes_succeeded == true) {
      iVar2 = (*this->m_pStream->_vptr_output_stream[2])
                        (this->m_pStream,this->m_out_buf,(ulong)(0x800 - this->m_out_buf_left));
      uVar1 = (undefined1)iVar2;
    }
    else {
      uVar1 = false;
    }
    this->m_all_stream_writes_succeeded = (bool)uVar1;
  }
  this->m_pOut_buf = this->m_out_buf;
  this->m_out_buf_left = 0x800;
  return;
}

Assistant:

void jpeg_encoder::flush_output_buffer()
	{
		if (m_out_buf_left != JPGE_OUT_BUF_SIZE)
			m_all_stream_writes_succeeded = m_all_stream_writes_succeeded && m_pStream->put_buf(m_out_buf, JPGE_OUT_BUF_SIZE - m_out_buf_left);
		m_pOut_buf = m_out_buf;
		m_out_buf_left = JPGE_OUT_BUF_SIZE;
	}